

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O0

Image * __thiscall nv::FloatImage::createImageGammaCorrect(FloatImage *this,float gamma)

{
  int iVar1;
  Image *pIVar2;
  int *piVar3;
  anon_union_4_2_12391d8d_for_Color32_0 *paVar4;
  double dVar5;
  anon_union_4_2_12391d8d_for_Color32_0 local_9c;
  int local_98 [3];
  uint8 local_89;
  int local_88;
  int iStack_84;
  uint8 a;
  int local_80;
  uint8 local_79;
  int local_78;
  int iStack_74;
  uint8 b;
  int local_70;
  uint8 local_69;
  int local_68;
  int iStack_64;
  uint8 g;
  int local_60;
  uint8 local_59;
  uint local_58;
  uint uStack_54;
  uint8 r;
  uint i;
  uint size;
  float *aChannel;
  float *bChannel;
  float *gChannel;
  float *rChannel;
  AutoPtr<nv::Image> local_20;
  AutoPtr<nv::Image> img;
  float gamma_local;
  FloatImage *this_local;
  
  img.m_ptr._4_4_ = gamma;
  if ((this->m_componentNum != 4) &&
     (iVar1 = nvAbort("m_componentNum == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/FloatImage.cpp"
                      ,0x76,"Image *nv::FloatImage::createImageGammaCorrect(float) const"),
     iVar1 == 1)) {
    raise(5);
  }
  pIVar2 = (Image *)operator_new(0x18);
  Image::Image(pIVar2);
  AutoPtr<nv::Image>::AutoPtr(&local_20,pIVar2);
  pIVar2 = AutoPtr<nv::Image>::operator->(&local_20);
  Image::allocate(pIVar2,(uint)this->m_width,(uint)this->m_height);
  gChannel = channel(this,0);
  bChannel = channel(this,1);
  aChannel = channel(this,2);
  _i = channel(this,3);
  uStack_54 = (uint)this->m_width * (uint)this->m_height;
  for (local_58 = 0; local_58 < uStack_54; local_58 = local_58 + 1) {
    dVar5 = std::pow((double)(ulong)(uint)gChannel[local_58],
                     (double)(ulong)(uint)(1.0 / img.m_ptr._4_4_));
    local_60 = (int)(SUB84(dVar5,0) * 255.0);
    iStack_64 = 0;
    local_68 = 0xff;
    piVar3 = clamp<int>(&local_60,&stack0xffffffffffffff9c,&local_68);
    local_59 = (uint8)*piVar3;
    dVar5 = std::pow((double)(ulong)(uint)bChannel[local_58],
                     (double)(ulong)(uint)(1.0 / img.m_ptr._4_4_));
    local_70 = (int)(SUB84(dVar5,0) * 255.0);
    iStack_74 = 0;
    local_78 = 0xff;
    piVar3 = clamp<int>(&local_70,&stack0xffffffffffffff8c,&local_78);
    local_69 = (uint8)*piVar3;
    dVar5 = std::pow((double)(ulong)(uint)aChannel[local_58],
                     (double)(ulong)(uint)(1.0 / img.m_ptr._4_4_));
    local_80 = (int)(SUB84(dVar5,0) * 255.0);
    iStack_84 = 0;
    local_88 = 0xff;
    piVar3 = clamp<int>(&local_80,&stack0xffffffffffffff7c,&local_88);
    local_79 = (uint8)*piVar3;
    local_98[2] = (int)(_i[local_58] * 255.0);
    local_98[1] = 0;
    local_98[0] = 0xff;
    piVar3 = clamp<int>(local_98 + 2,local_98 + 1,local_98);
    local_89 = (uint8)*piVar3;
    Color32::Color32((Color32 *)&local_9c.field_0,local_59,local_69,local_79,local_89);
    pIVar2 = AutoPtr<nv::Image>::operator->(&local_20);
    paVar4 = &Image::pixel(pIVar2,local_58)->field_0;
    *paVar4 = local_9c;
  }
  pIVar2 = AutoPtr<nv::Image>::release(&local_20);
  AutoPtr<nv::Image>::~AutoPtr(&local_20);
  return pIVar2;
}

Assistant:

Image * FloatImage::createImageGammaCorrect(float gamma/*= 2.2f*/) const
{
	nvCheck(m_componentNum == 4);
	
	AutoPtr<Image> img(new Image());
	img->allocate(m_width, m_height);
	
	const float * rChannel = this->channel(0);
	const float * gChannel = this->channel(1);
	const float * bChannel = this->channel(2);
	const float * aChannel = this->channel(3);

	const uint size = m_width * m_height;
	for(uint i = 0; i < size; i++)
	{
		const uint8 r = nv::clamp(int(255.0f * pow(rChannel[i], 1.0f/gamma)), 0, 255);
		const uint8 g = nv::clamp(int(255.0f * pow(gChannel[i], 1.0f/gamma)), 0, 255);
		const uint8 b = nv::clamp(int(255.0f * pow(bChannel[i], 1.0f/gamma)), 0, 255);
		const uint8 a = nv::clamp(int(255.0f * aChannel[i]), 0, 255);

		img->pixel(i) = Color32(r, g, b, a);
	}
	
	return img.release();
}